

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

Kit_Edge_t Kit_GraphAddNodeOr(Kit_Graph_t *pGraph,Kit_Edge_t eEdge0,Kit_Edge_t eEdge1)

{
  Kit_Edge_t KVar1;
  Kit_Node_t *pKVar2;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph_local;
  Kit_Edge_t eEdge1_local;
  Kit_Edge_t eEdge0_local;
  
  pKVar2 = Kit_GraphAppendNode(pGraph);
  pKVar2->eEdge0 = eEdge0;
  pKVar2->eEdge1 = eEdge1;
  *(uint *)&pKVar2->field_0x10 =
       *(uint *)&pKVar2->field_0x10 & 0xffff7fff | ((uint)eEdge0 & 1) << 0xf;
  *(uint *)&pKVar2->field_0x10 =
       *(uint *)&pKVar2->field_0x10 & 0xfffeffff | ((uint)eEdge1 & 1) << 0x10;
  *(uint *)&pKVar2->field_0x10 = *(uint *)&pKVar2->field_0x10 & 0xffffbfff | 0x4000;
  pKVar2->eEdge0 =
       (Kit_Edge_t)((uint)pKVar2->eEdge0 & 0xfffffffe | (uint)(((uint)pKVar2->eEdge0 & 1) == 0));
  pKVar2->eEdge1 =
       (Kit_Edge_t)((uint)pKVar2->eEdge1 & 0xfffffffe | (uint)(((uint)pKVar2->eEdge1 & 1) == 0));
  KVar1 = Kit_EdgeCreate(pGraph->nSize + -1,1);
  return KVar1;
}

Assistant:

Kit_Edge_t Kit_GraphAddNodeOr( Kit_Graph_t * pGraph, Kit_Edge_t eEdge0, Kit_Edge_t eEdge1 )
{
    Kit_Node_t * pNode;
    // get the new node
    pNode = Kit_GraphAppendNode( pGraph );
    // set the inputs and other info
    pNode->eEdge0 = eEdge0;
    pNode->eEdge1 = eEdge1;
    pNode->fCompl0 = eEdge0.fCompl;
    pNode->fCompl1 = eEdge1.fCompl;
    // make adjustments for the OR gate
    pNode->fNodeOr = 1;
    pNode->eEdge0.fCompl = !pNode->eEdge0.fCompl;
    pNode->eEdge1.fCompl = !pNode->eEdge1.fCompl;
    return Kit_EdgeCreate( pGraph->nSize - 1, 1 );
}